

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_csm.c
# Opt level: O1

void * CSM_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *opaque;
  void *pvVar2;
  PHYSFS_uint16 PVar3;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint8 fn_len;
  PHYSFS_uint16 count;
  PHYSFS_uint32 size;
  PHYSFS_uint8 buf [4];
  char name_1 [12];
  byte local_4b;
  PHYSFS_uint16 local_4a;
  PHYSFS_uint32 local_48;
  PHYSFS_uint32 local_44;
  int local_40;
  char local_3c [12];
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_csm.c"
                  ,0x49,"void *CSM_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&local_40,4);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    if (local_40 == 0x64695343) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&local_4a,2);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      local_4a = PHYSFS_swapULE16(local_4a);
      opaque = UNPK_openArchive(io,0,1);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      if (local_4a == 0) {
        return opaque;
      }
      PVar3 = local_4a;
      while ((((iVar1 = __PHYSFS_readAll(io,&local_4b,1), iVar1 != 0 &&
               (iVar1 = __PHYSFS_readAll(io,local_3c,0xc), iVar1 != 0)) &&
              (iVar1 = __PHYSFS_readAll(io,&local_48,4), iVar1 != 0)) &&
             (iVar1 = __PHYSFS_readAll(io,&local_44,4), iVar1 != 0))) {
        if (0xc < local_4b) {
          local_4b = 0xc;
        }
        local_3c[local_4b] = '\0';
        local_48 = PHYSFS_swapULE32(local_48);
        local_44 = PHYSFS_swapULE32(local_44);
        pvVar2 = UNPK_addEntry(opaque,local_3c,0,-1,-1,(ulong)local_44,(ulong)local_48);
        if (pvVar2 == (void *)0x0) break;
        PVar3 = PVar3 - 1;
        if (PVar3 == 0) {
          return opaque;
        }
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *CSM_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[4];
    PHYSFS_uint16 count;
    void *unpkarc;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "CSid", 4) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE16(count);


    unpkarc = UNPK_openArchive(io, 0, 1);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!csmLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}